

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

int main(void)

{
  long lVar1;
  long lVar2;
  mraa_gpio_context gpio_2;
  mraa_gpio_context gpio_1;
  mraa_result_t status;
  
  signal(2,sig_handler);
  mraa_init();
  lVar1 = mraa_gpio_init(0x17);
  if (lVar1 == 0) {
    fprintf(_stderr,"Failed to initialize GPIO %d\n",0x17);
    mraa_deinit();
  }
  else {
    lVar2 = mraa_gpio_init(0x18);
    if (lVar2 == 0) {
      fprintf(_stderr,"Failed to initialize GPIO %d\n",0x18);
      mraa_deinit();
    }
    else {
      gpio_1._0_4_ = mraa_gpio_dir(lVar1,0);
      if (((int)gpio_1 == 0) && (gpio_1._0_4_ = mraa_gpio_dir(lVar2,0), (int)gpio_1 == 0)) {
        while (flag != 0) {
          gpio_1._0_4_ = mraa_gpio_write(lVar1,1);
          if (((int)gpio_1 != 0) || (gpio_1._0_4_ = mraa_gpio_write(lVar2,0), (int)gpio_1 != 0))
          goto LAB_001013bc;
          sleep(1);
          gpio_1._0_4_ = mraa_gpio_write(lVar1,0);
          if (((int)gpio_1 != 0) || (gpio_1._0_4_ = mraa_gpio_write(lVar2,1), (int)gpio_1 != 0))
          goto LAB_001013bc;
          sleep(1);
        }
        gpio_1._0_4_ = mraa_gpio_close(lVar1);
        if (((int)gpio_1 == 0) && (gpio_1._0_4_ = mraa_gpio_close(lVar2), (int)gpio_1 == 0)) {
          mraa_deinit();
          return 0;
        }
      }
LAB_001013bc:
      mraa_result_print((int)gpio_1);
      mraa_deinit();
    }
  }
  return 1;
}

Assistant:

int
main(void)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_gpio_context gpio_1, gpio_2;

    /* install signal handler */
    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize GPIO pin */
    gpio_1 = mraa_gpio_init(GPIO_PIN_1);
    if (gpio_1 == NULL) {
        fprintf(stderr, "Failed to initialize GPIO %d\n", GPIO_PIN_1);
        mraa_deinit();
        return EXIT_FAILURE;
    }

    /* initialize GPIO pin */
    gpio_2 = mraa_gpio_init(GPIO_PIN_2);
    if (gpio_2 == NULL) {
        fprintf(stderr, "Failed to initialize GPIO %d\n", GPIO_PIN_2);
        mraa_deinit();
        return EXIT_FAILURE;
    }

    /* set GPIO to output */
    status = mraa_gpio_dir(gpio_1, MRAA_GPIO_OUT);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    /* set GPIO to output */
    status = mraa_gpio_dir(gpio_2, MRAA_GPIO_OUT);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    /* toggle both GPIO's */
    while (flag) {
        status = mraa_gpio_write(gpio_1, 1);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        status = mraa_gpio_write(gpio_2, 0);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        sleep(1);

        status = mraa_gpio_write(gpio_1, 0);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        status = mraa_gpio_write(gpio_2, 1);
        if (status != MRAA_SUCCESS) {
            goto err_exit;
        }

        sleep(1);
    }

    /* release gpio's */
    status = mraa_gpio_close(gpio_1);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    /* close GPIO */
    status = mraa_gpio_close(gpio_2);
    if (status != MRAA_SUCCESS) {
        goto err_exit;
    }

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}